

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict abstract_declarator(c2m_ctx_t c2m_ctx,int no_err_p)

{
  ushort uVar1;
  node_t pnVar2;
  node_t pnVar3;
  token_t ptVar4;
  node_t_conflict pnVar5;
  size_t mark;
  node_t_conflict pnVar6;
  node_t_conflict pnVar7;
  node_t op;
  node_code_t nc;
  anon_union_16_10_0af5b411_for_u *paVar8;
  c2m_ctx_t c2m_ctx_00;
  undefined8 uVar9;
  char *pcVar10;
  pos_t pVar11;
  
  if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x2a) {
    pnVar5 = direct_abstract_declarator(c2m_ctx,no_err_p);
    return pnVar5;
  }
  pnVar5 = pointer(c2m_ctx,no_err_p);
  if (pnVar5 == &err_struct) {
    return &err_struct;
  }
  mark = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
  pnVar6 = direct_abstract_declarator(c2m_ctx,1);
  c2m_ctx_00 = c2m_ctx;
  record_stop(c2m_ctx,mark,(uint)(pnVar6 == &err_struct));
  if (pnVar6 == &err_struct) {
    pVar11 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar5->uid);
    pnVar6 = new_node(c2m_ctx,N_IGNORE);
    pnVar7 = new_node(c2m_ctx,N_LIST);
    pnVar6 = new_node2(c2m_ctx,N_DECL,pnVar6,pnVar7);
    c2m_ctx_00 = c2m_ctx;
    add_pos(c2m_ctx,pnVar6,pVar11);
  }
  if (pnVar5 == (node_t_conflict)0x0) {
    return pnVar6;
  }
  pnVar7 = (((pnVar6->u).ops.head)->op_link).next;
  if (pnVar7->code != N_LIST) {
LAB_0019762d:
    __assert_fail("list->code == N_LIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1366,"node_t abstract_declarator(c2m_ctx_t, int)");
  }
  op = (pnVar5->u).ops.head;
  if (op == (node_t)0x0) {
    return pnVar6;
  }
  while( true ) {
    pnVar2 = (op->op_link).prev;
    pnVar3 = (op->op_link).next;
    if (pnVar2 == (node_t)0x0) {
      paVar8 = &pnVar5->u;
      if ((node_t_conflict)(pnVar5->u).s.s != op) {
        abstract_declarator_cold_1();
        goto LAB_0019762d;
      }
    }
    else {
      paVar8 = (anon_union_16_10_0af5b411_for_u *)&(pnVar2->op_link).next;
    }
    (paVar8->ops).head = pnVar3;
    if (pnVar3 == (node_t)0x0) break;
    (pnVar3->op_link).prev = pnVar2;
    (op->op_link).prev = (node_t)0x0;
    (op->op_link).next = (node_t)0x0;
    c2m_ctx_00 = c2m_ctx;
    op_append(c2m_ctx,pnVar7,op);
    op = pnVar3;
  }
  if ((node_t_conflict)(pnVar5->u).s.len == op) {
    (pnVar5->u).ops.tail = pnVar2;
    (op->op_link).prev = (node_t)0x0;
    (op->op_link).next = (node_t)0x0;
    op_append(c2m_ctx,pnVar7,op);
    return pnVar6;
  }
  abstract_declarator_cold_2();
  ptVar4 = c2m_ctx_00->parse_ctx->curr_token;
  uVar1 = *(ushort *)ptVar4;
  if (uVar1 < 0x12e) {
    if (uVar1 == 0x114) {
      pcVar10 = (ptVar4->pos).fname;
      uVar9._0_4_ = (ptVar4->pos).lno;
      uVar9._4_4_ = (ptVar4->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx_00->recorded_tokens);
      nc = N_ATOMIC;
    }
    else {
      if (uVar1 != 0x11e) {
LAB_001976d1:
        if (c2m_ctx_00->parse_ctx->record_level != 0) {
          return &err_struct;
        }
        syntax_error(c2m_ctx_00,"a type qualifier");
        return &err_struct;
      }
      pcVar10 = (ptVar4->pos).fname;
      uVar9._0_4_ = (ptVar4->pos).lno;
      uVar9._4_4_ = (ptVar4->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx_00->recorded_tokens);
      nc = N_CONST;
    }
  }
  else if (uVar1 == 0x12e) {
    pcVar10 = (ptVar4->pos).fname;
    uVar9._0_4_ = (ptVar4->pos).lno;
    uVar9._4_4_ = (ptVar4->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx_00->recorded_tokens);
    nc = N_RESTRICT;
  }
  else {
    if (uVar1 != 0x13b) goto LAB_001976d1;
    pcVar10 = (ptVar4->pos).fname;
    uVar9._0_4_ = (ptVar4->pos).lno;
    uVar9._4_4_ = (ptVar4->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx_00->recorded_tokens);
    nc = N_VOLATILE;
  }
  pnVar5 = new_node(c2m_ctx_00,nc);
  pVar11.lno = (int)uVar9;
  pVar11.ln_pos = (int)((ulong)uVar9 >> 0x20);
  pVar11.fname = pcVar10;
  add_pos(c2m_ctx_00,pnVar5,pVar11);
  return pnVar5;
}

Assistant:

D (abstract_declarator) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, p = NULL, r, el, next_el;

  if (C ('*')) {
    P (pointer);
    p = r;
    if ((r = TRY (direct_abstract_declarator)) == err_node)
      r = new_pos_node2 (c2m_ctx, N_DECL, POS (p), new_node (c2m_ctx, N_IGNORE),
                         new_node (c2m_ctx, N_LIST));
  } else {
    P (direct_abstract_declarator);
  }
  if (p != NULL) {
    list = NL_NEXT (NL_HEAD (r->u.ops));
    assert (list->code == N_LIST);
    for (el = NL_HEAD (p->u.ops); el != NULL; el = next_el) {
      next_el = NL_NEXT (el);
      NL_REMOVE (p->u.ops, el);
      op_append (c2m_ctx, list, el);
    }
  }
  return r;
}